

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames_s16(ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  ma_uint64 mVar5;
  ma_uint64 mVar6;
  ulong uVar7;
  ushort uVar8;
  uint shift;
  int iVar9;
  long lVar10;
  long lVar11;
  ma_int16 *pmVar12;
  ulong uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  ulong uVar16;
  uint j;
  long lVar17;
  float fVar18;
  double dVar19;
  undefined8 local_1038;
  
  if (framesToRead != 0 && pWav != (ma_dr_wav *)0x0) {
    if (pBufferOut == (ma_int16 *)0x0) {
      mVar5 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
      return mVar5;
    }
    uVar8 = pWav->translatedFormatTag;
    switch(uVar8) {
    case 1:
      memset(&local_1038,0,0x1000);
      if (pWav->bitsPerSample == 0x10) {
        mVar5 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
        return mVar5;
      }
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar4 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar4 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar8 & 0xfffe) != 6) || (uVar13 = 0, uVar4 == (pWav->fmt).channels)) {
        uVar13 = (ulong)uVar4;
      }
      if ((uint)uVar13 != 0) {
        uVar8 = pWav->channels;
        uVar7 = uVar13 / uVar8;
        if ((uint)uVar13 < (uint)uVar8) {
          return 0;
        }
        if ((int)(uVar13 % (ulong)uVar8) == 0) {
          uVar4 = (uint)uVar7;
          mVar5 = 0;
          do {
            if (framesToRead == 0) {
              return mVar5;
            }
            bVar3 = false;
            uVar16 = 0x1000 / uVar13;
            if (framesToRead < 0x1000 / uVar13) {
              uVar16 = framesToRead;
            }
            mVar6 = ma_dr_wav_read_pcm_frames(pWav,uVar16,&local_1038);
            if (mVar6 != 0) {
              lVar10 = pWav->channels * mVar6;
              if (lVar10 * uVar7 < 0x1001) {
                switch(uVar4) {
                case 1:
                  if (lVar10 != 0) {
                    lVar11 = 0;
                    do {
                      pBufferOut[lVar11] =
                           (ushort)*(byte *)((long)&local_1038 + lVar11) << 8 ^ 0x8000;
                      lVar11 = lVar11 + 1;
                    } while (lVar10 - lVar11 != 0);
                  }
                  break;
                case 2:
                  if (lVar10 != 0) {
                    lVar11 = 0;
                    do {
                      pBufferOut[lVar11] = *(ma_int16 *)((long)&local_1038 + lVar11 * 2);
                      lVar11 = lVar11 + 1;
                    } while (lVar10 - lVar11 != 0);
                  }
                  break;
                case 3:
                  if (lVar10 != 0) {
                    lVar11 = (long)&local_1038 + 2;
                    lVar17 = 0;
                    do {
                      pBufferOut[lVar17] = *(ma_int16 *)(lVar11 + -1);
                      lVar17 = lVar17 + 1;
                      lVar11 = lVar11 + 3;
                    } while (lVar10 - lVar17 != 0);
                  }
                  break;
                case 4:
                  if (lVar10 != 0) {
                    lVar11 = 0;
                    do {
                      pBufferOut[lVar11] = *(ma_int16 *)((long)&local_1038 + lVar11 * 4 + 2);
                      lVar11 = lVar11 + 1;
                    } while (lVar10 - lVar11 != 0);
                  }
                  break;
                default:
                  if (uVar4 < 9) {
                    if (lVar10 != 0) {
                      lVar11 = 0;
                      puVar14 = &local_1038;
                      pmVar12 = pBufferOut;
                      do {
                        lVar17 = 0;
                        uVar15 = 0;
                        uVar16 = uVar7;
                        iVar9 = uVar4 * -8 + 0x40;
                        do {
                          uVar15 = uVar15 | (ulong)*(byte *)((long)puVar14 + lVar17) <<
                                            ((byte)iVar9 & 0x3f);
                          iVar9 = iVar9 + 8;
                          lVar17 = lVar17 + 1;
                          uVar16 = uVar16 - 1;
                        } while (uVar16 != 0);
                        puVar14 = (undefined8 *)((long)puVar14 + uVar7);
                        *pmVar12 = (ma_int16)(uVar15 >> 0x30);
                        pmVar12 = pmVar12 + 1;
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != lVar10);
                    }
                  }
                  else {
                    memset(pBufferOut,0,lVar10 * 2);
                  }
                }
                pBufferOut = pBufferOut + lVar10;
                framesToRead = framesToRead - mVar6;
                mVar5 = mVar5 + mVar6;
                bVar3 = true;
              }
              else {
                bVar3 = false;
              }
            }
          } while (bVar3);
          return mVar5;
        }
        return 0;
      }
      break;
    case 2:
      mVar5 = ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav,framesToRead,pBufferOut);
      return mVar5;
    case 3:
      memset(&local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar4 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar4 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar8 & 0xfffe) != 6) || (uVar13 = 0, uVar4 == (pWav->fmt).channels)) {
        uVar13 = (ulong)uVar4;
      }
      if ((uint)uVar13 != 0) {
        uVar8 = pWav->channels;
        uVar7 = uVar13 / uVar8;
        iVar9 = (int)uVar7;
        if ((uint)uVar13 < (uint)uVar8) {
          return 0;
        }
        if ((int)(uVar13 % (ulong)uVar8) == 0) {
          mVar5 = 0;
          do {
            if (framesToRead == 0) {
              return mVar5;
            }
            bVar3 = false;
            uVar16 = 0x1000 / uVar13;
            if (framesToRead < 0x1000 / uVar13) {
              uVar16 = framesToRead;
            }
            mVar6 = ma_dr_wav_read_pcm_frames(pWav,uVar16,&local_1038);
            if (mVar6 != 0) {
              lVar10 = pWav->channels * mVar6;
              if (lVar10 * uVar7 < 0x1001) {
                if (iVar9 == 8) {
                  if (lVar10 != 0) {
                    lVar11 = 0;
                    do {
                      dVar2 = (double)(&local_1038)[lVar11];
                      uVar8 = 0x8000;
                      if (-1.0 <= dVar2) {
                        dVar19 = 1.0;
                        if (dVar2 <= 1.0) {
                          dVar19 = dVar2;
                        }
                        uVar8 = (ushort)(int)((dVar19 + 1.0) * 32767.5) ^ 0x8000;
                      }
                      pBufferOut[lVar11] = uVar8;
                      lVar11 = lVar11 + 1;
                    } while (lVar10 - lVar11 != 0);
                  }
                }
                else if (iVar9 == 4) {
                  if (lVar10 != 0) {
                    lVar11 = 0;
                    do {
                      fVar1 = *(float *)((long)&local_1038 + lVar11 * 4);
                      uVar8 = 0x8000;
                      if (-1.0 <= fVar1) {
                        fVar18 = 1.0;
                        if (fVar1 <= 1.0) {
                          fVar18 = fVar1;
                        }
                        uVar8 = (ushort)(int)((fVar18 + 1.0) * 32767.5) ^ 0x8000;
                      }
                      pBufferOut[lVar11] = uVar8;
                      lVar11 = lVar11 + 1;
                    } while (lVar10 - lVar11 != 0);
                  }
                }
                else {
                  memset(pBufferOut,0,lVar10 * 2);
                }
                pBufferOut = pBufferOut + lVar10;
                framesToRead = framesToRead - mVar6;
                mVar5 = mVar5 + mVar6;
                bVar3 = true;
              }
              else {
                bVar3 = false;
              }
            }
          } while (bVar3);
          return mVar5;
        }
        return 0;
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      memset(&local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar4 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar4 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar8 & 0xfffe) != 6) || (uVar13 = 0, uVar4 == (pWav->fmt).channels)) {
        uVar13 = (ulong)uVar4;
      }
      if ((uint)uVar13 != 0) {
        uVar8 = pWav->channels;
        if ((uint)uVar13 < (uint)uVar8) {
          return 0;
        }
        if ((int)(uVar13 % (ulong)uVar8) == 0) {
          mVar5 = 0;
          do {
            if (framesToRead == 0) {
              return mVar5;
            }
            bVar3 = false;
            uVar7 = 0x1000 / uVar13;
            if (framesToRead < 0x1000 / uVar13) {
              uVar7 = framesToRead;
            }
            mVar6 = ma_dr_wav_read_pcm_frames(pWav,uVar7,&local_1038);
            if (mVar6 != 0) {
              lVar10 = pWav->channels * mVar6;
              if (lVar10 * (uVar13 / uVar8) < 0x1001) {
                if (lVar10 != 0) {
                  lVar11 = 0;
                  do {
                    pBufferOut[lVar11] = g_ma_dr_wavAlawTable[*(byte *)((long)&local_1038 + lVar11)]
                    ;
                    lVar11 = lVar11 + 1;
                  } while (lVar10 - lVar11 != 0);
                }
                pBufferOut = pBufferOut + lVar10;
                framesToRead = framesToRead - mVar6;
                mVar5 = mVar5 + mVar6;
                bVar3 = true;
              }
              else {
                bVar3 = false;
              }
            }
          } while (bVar3);
          return mVar5;
        }
        return 0;
      }
      break;
    case 7:
      memset(&local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar4 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar4 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar8 & 0xfffe) != 6) || (uVar13 = 0, uVar4 == (pWav->fmt).channels)) {
        uVar13 = (ulong)uVar4;
      }
      if ((uint)uVar13 != 0) {
        uVar8 = pWav->channels;
        if ((uint)uVar13 < (uint)uVar8) {
          return 0;
        }
        if ((int)(uVar13 % (ulong)uVar8) == 0) {
          mVar5 = 0;
          do {
            if (framesToRead == 0) {
              return mVar5;
            }
            bVar3 = false;
            uVar7 = 0x1000 / uVar13;
            if (framesToRead < 0x1000 / uVar13) {
              uVar7 = framesToRead;
            }
            mVar6 = ma_dr_wav_read_pcm_frames(pWav,uVar7,&local_1038);
            if (mVar6 != 0) {
              lVar10 = pWav->channels * mVar6;
              if (lVar10 * (uVar13 / uVar8) < 0x1001) {
                if (lVar10 != 0) {
                  lVar11 = 0;
                  do {
                    pBufferOut[lVar11] =
                         g_ma_dr_wavMulawTable[*(byte *)((long)&local_1038 + lVar11)];
                    lVar11 = lVar11 + 1;
                  } while (lVar10 - lVar11 != 0);
                }
                pBufferOut = pBufferOut + lVar10;
                framesToRead = framesToRead - mVar6;
                mVar5 = mVar5 + mVar6;
                bVar3 = true;
              }
              else {
                bVar3 = false;
              }
            }
          } while (bVar3);
          return mVar5;
        }
        return 0;
      }
      break;
    default:
      if (uVar8 == 0x11) {
        mVar5 = ma_dr_wav_read_pcm_frames_s16__ima(pWav,framesToRead,pBufferOut);
        return mVar5;
      }
    }
  }
  return 0;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s16(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(ma_int16) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(ma_int16) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_s16__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_s16__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_s16__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_s16__mulaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s16__ima(pWav, framesToRead, pBufferOut);
    }
    return 0;
}